

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc_error_estimator.cpp
# Opt level: O3

double __thiscall
ltc_error_estimator::estimate_partial_error
          (ltc_error_estimator *this,brdf *sample_source,brdf *other_brdf,vec2 *random_parameters)

{
  vec3 *pvVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar2;
  float local_50;
  float local_4c;
  float local_48;
  undefined1 local_38 [16];
  
  pvVar1 = &this->_view_dir;
  (*sample_source->_vptr_brdf[4])(sample_source,pvVar1,random_parameters);
  (*sample_source->_vptr_brdf[3])(sample_source,local_38,pvVar1,&local_4c);
  local_48 = extraout_XMM0_Da;
  (*other_brdf->_vptr_brdf[3])(other_brdf,local_38,pvVar1,&local_50);
  dVar2 = (double)ABS(local_48 - extraout_XMM0_Da_00);
  return (dVar2 * dVar2 * dVar2) / (double)(ABS(local_50) + ABS(local_4c));
}

Assistant:

double ltc_error_estimator::estimate_partial_error(
  const brdf &sample_source,
  const brdf &other_brdf,
  const glm::vec2 &random_parameters
) const
{
  // Use Multiple Importance Sampling technique with balance heuristics used as weight function.

  const glm::vec3 light_dir = sample_source.sample(_view_dir, random_parameters);

  float source_pdf, other_pdf;

  auto source_value = sample_source.evaluate(light_dir, _view_dir, source_pdf);
  auto other_value = other_brdf.evaluate(light_dir, _view_dir, other_pdf);

  source_pdf = fabs(source_pdf);
  other_pdf = fabs(other_pdf);

  double error1 = std::fabs(source_value - other_value);
  auto error3 = error1 * error1 * error1;
  auto partial_error = error3 / (source_pdf + other_pdf);

  return partial_error;
}